

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

error_info * __thiscall
toml::detail::context<toml::type_config>::pop_last_error
          (error_info *__return_storage_ptr__,context<toml::type_config> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer peVar3;
  pointer pcVar4;
  undefined8 uVar5;
  pointer ppVar6;
  error_info *__p;
  
  peVar3 = (this->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &(__return_storage_ptr__->title_).field_2;
  (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = peVar3[-1].title_._M_dataplus._M_p;
  paVar2 = &peVar3[-1].title_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&peVar3[-1].title_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->title_)._M_dataplus._M_p = pcVar4;
    (__return_storage_ptr__->title_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__return_storage_ptr__->title_)._M_string_length = peVar3[-1].title_._M_string_length;
  peVar3[-1].title_._M_dataplus._M_p = (pointer)paVar2;
  peVar3[-1].title_._M_string_length = 0;
  peVar3[-1].title_.field_2._M_local_buf[0] = '\0';
  ppVar6 = peVar3[-1].locations_.
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       peVar3[-1].locations_.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       peVar3[-1].locations_.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peVar3[-1].locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3[-1].locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  peVar3[-1].locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &(__return_storage_ptr__->suffix_).field_2;
  (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = peVar3[-1].suffix_._M_dataplus._M_p;
  paVar2 = &peVar3[-1].suffix_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&peVar3[-1].suffix_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = pcVar4;
    (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__return_storage_ptr__->suffix_)._M_string_length = peVar3[-1].suffix_._M_string_length;
  peVar3[-1].suffix_._M_dataplus._M_p = (pointer)paVar2;
  peVar3[-1].suffix_._M_string_length = 0;
  peVar3[-1].suffix_.field_2._M_local_buf[0] = '\0';
  __p = (this->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_finish + -1;
  (this->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
  super__Vector_impl_data._M_finish = __p;
  std::allocator_traits<std::allocator<toml::error_info>_>::destroy<toml::error_info>
            ((allocator_type *)&this->errors_,__p);
  return __return_storage_ptr__;
}

Assistant:

error_info pop_last_error()
    {
        assert( ! errors_.empty());
        auto e = std::move(errors_.back());
        errors_.pop_back();
        return e;
    }